

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_compile_trailers(curl_slist *trailers,dynbuf *b,Curl_easy *handle)

{
  char *__s;
  CURLcode CVar1;
  char *pcVar2;
  char *str;
  
  if (((handle->state).field_0x74d & 0x40) == 0) {
    str = "\n";
    if (((handle->set).field_0x8ba & 0x10) == 0) {
      str = "\r\n";
    }
  }
  else {
    str = "\n";
  }
  if (trailers != (curl_slist *)0x0) {
    do {
      __s = trailers->data;
      pcVar2 = strchr(__s,0x3a);
      if ((pcVar2 == (char *)0x0) || (pcVar2[1] != ' ')) {
        if (((handle->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(handle,"Malformatted trailing header, skipping trailer");
        }
      }
      else {
        CVar1 = Curl_dyn_add(b,__s);
        if ((CVar1 != CURLE_OK) || (CVar1 = Curl_dyn_add(b,str), CVar1 != CURLE_OK)) {
          return CVar1;
        }
      }
      trailers = trailers->next;
    } while (trailers != (curl_slist *)0x0);
  }
  CVar1 = Curl_dyn_add(b,str);
  return CVar1;
}

Assistant:

CURLcode Curl_http_compile_trailers(struct curl_slist *trailers,
                                    struct dynbuf *b,
                                    struct Curl_easy *handle)
{
  char *ptr = NULL;
  CURLcode result = CURLE_OK;
  const char *endofline_native = NULL;
  const char *endofline_network = NULL;

  if(
#ifdef CURL_DO_LINEEND_CONV
     (handle->state.prefer_ascii) ||
#endif
     (handle->set.crlf)) {
    /* \n will become \r\n later on */
    endofline_native  = "\n";
    endofline_network = "\x0a";
  }
  else {
    endofline_native  = "\r\n";
    endofline_network = "\x0d\x0a";
  }

  while(trailers) {
    /* only add correctly formatted trailers */
    ptr = strchr(trailers->data, ':');
    if(ptr && *(ptr + 1) == ' ') {
      result = Curl_dyn_add(b, trailers->data);
      if(result)
        return result;
      result = Curl_dyn_add(b, endofline_native);
      if(result)
        return result;
    }
    else
      infof(handle, "Malformatted trailing header, skipping trailer");
    trailers = trailers->next;
  }
  result = Curl_dyn_add(b, endofline_network);
  return result;
}